

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall
CS248::Application::draw_string(Application *this,float x,float y,string *str,size_t size,Color *c)

{
  int iVar1;
  size_t *in_RCX;
  string *in_RSI;
  int line_index;
  undefined4 in_stack_ffffffffffffff38;
  vector<int,_std::allocator<int>_> *this_00;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  OSDText *in_stack_ffffffffffffffb0;
  Color in_stack_ffffffffffffffb8;
  
  this_00 = (vector<int,_std::allocator<int>_> *)0x3ff0000000000000;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RSI);
  iVar1 = OSDText::add_line(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa8,(string *)in_RCX[1],*in_RCX,
                            in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::vector<int,_std::allocator<int>_>::push_back
            (this_00,(value_type_conflict3 *)CONCAT44(iVar1,in_stack_ffffffffffffff38));
  return;
}

Assistant:

inline void Application::draw_string(float x, float y, string str, size_t size,
                                     const Color &c) {
  int line_index = textManager.add_line((x * 2 / screenW) - 1.0,
                                        (-y * 2 / screenH) + 1.0, str, size, c);
  messages.push_back(line_index);
}